

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

VirtualIterator<unsigned_int> __thiscall Kernel::Clause::getVariableIterator(Clause *this)

{
  long *plVar1;
  MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>
  master;
  bool bVar2;
  ItemList *pIVar3;
  undefined8 *puVar4;
  long in_RSI;
  long *local_a0;
  undefined8 local_98;
  undefined4 uStack_7c;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>
  local_78;
  FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
  local_40;
  
  master._inner._iter._func.a = (Literal *(*) [1])in_RSI;
  master._0_8_ = local_98;
  master._inner._iter._inner._next = 0;
  master._inner._iter._inner._from = 0;
  master._inner._iter._16_8_ =
       CONCAT44(uStack_7c,*(undefined4 *)(in_RSI + 0x38)) & 0xffffffff000fffff;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
  ::FlatteningIterator(&local_40,master);
  ::Lib::
  getMappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause_const&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*const&>>,Kernel::VariableIteratorFn,Lib::VirtualIterator<Kernel::TermList>>>,Kernel::OrdVarNumberExtractorFn>
            (&local_78,(Lib *)&local_40);
  bVar2 = ::Lib::
          FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
          ::hasNext(&local_78._inner);
  if (bVar2) {
    local_a0 = (long *)::operator_new(0x20);
    *(undefined4 *)(local_a0 + 1) = 0;
    *local_a0 = (long)&PTR__UniquePersistentIterator_00b66ef0;
    pIVar3 = ::Lib::
             UniquePersistentIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>_>
             ::getUniqueItemList(&local_78,(size_t *)(local_a0 + 3));
    local_a0[2] = (long)pIVar3;
    *(int *)(local_a0 + 1) = (int)local_a0[1] + 1;
  }
  else {
    ::Lib::VirtualIterator<unsigned_int>::getEmpty();
  }
  puVar4 = (undefined8 *)
           ::Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  if (local_a0 != (long *)0x0) {
    *(int *)(local_a0 + 1) = (int)local_a0[1] + 1;
  }
  *(undefined4 *)(puVar4 + 1) = 0;
  *puVar4 = &PTR__ProxyIterator_00b66f48;
  puVar4[2] = local_a0;
  if (local_a0 == (long *)0x0) {
    *(undefined8 **)&this->super_Unit = puVar4;
    *(undefined4 *)(puVar4 + 1) = 1;
  }
  else {
    *(int *)(local_a0 + 1) = (int)local_a0[1] + 1;
    *(undefined8 **)&this->super_Unit = puVar4;
    *(int *)(puVar4 + 1) = *(int *)(puVar4 + 1) + 1;
    plVar1 = local_a0 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_a0 + 8))();
    }
  }
  if (local_a0 != (long *)0x0) {
    plVar1 = local_a0 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_a0 + 8))();
    }
  }
  if ((local_78._inner._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._isSome ==
       true) &&
     (local_78._inner._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._elem._elem
      != (Value)0x0)) {
    plVar1 = (long *)((long)local_78._inner._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._elem._elem +
                     8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_78._inner._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._elem._elem +
                  8))();
    }
  }
  if ((local_40._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._isSome == true)
     && (local_40._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._elem._elem !=
         (Value)0x0)) {
    plVar1 = (long *)((long)local_40._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._elem._elem +
                     8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_40._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>._elem._elem +
                  8))();
    }
  }
  return (VirtualIterator<unsigned_int>)(IteratorCore<unsigned_int> *)this;
}

Assistant:

VirtualIterator<unsigned> Clause::getVariableIterator() const
{
  return pvi( getUniquePersistentIterator(
      getMappingIterator(
	  getMapAndFlattenIterator(
	      iterLits(),
	      VariableIteratorFn()),
	  OrdVarNumberExtractorFn())));
}